

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O1

void __thiscall xercesc_4_0::XMLUri::setHost(XMLUri *this,XMLCh *newHost)

{
  short *psVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  MalformedURLException *this_00;
  size_t __n;
  
  if (newHost == (XMLCh *)0x0) {
    if (this->fHost != (XMLCh *)0x0) {
      (*this->fMemoryManager->_vptr_MemoryManager[4])();
    }
    this->fHost = (XMLCh *)0x0;
    setUserInfo(this,(XMLCh *)0x0);
    this->fPort = -1;
  }
  else {
    if (*newHost != L'\0') {
      bVar2 = isWellFormedAddress(newHost,this->fMemoryManager);
      if (!bVar2) {
        this_00 = (MalformedURLException *)__cxa_allocate_exception(0x30);
        MalformedURLException::MalformedURLException
                  (this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                   ,0x4b3,XMLNUM_URI_Component_Not_Conformant,(XMLCh *)errMsg_HOST,newHost,
                   (XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
        __cxa_throw(this_00,&MalformedURLException::typeinfo,XMLException::~XMLException);
      }
    }
    if (this->fHost != (XMLCh *)0x0) {
      (*this->fMemoryManager->_vptr_MemoryManager[4])();
    }
    __n = 0;
    do {
      psVar1 = (short *)((long)newHost + __n);
      __n = __n + 2;
    } while (*psVar1 != 0);
    iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,__n);
    memcpy((XMLCh *)CONCAT44(extraout_var,iVar3),newHost,__n);
    this->fHost = (XMLCh *)CONCAT44(extraout_var,iVar3);
    if (this->fRegAuth != (XMLCh *)0x0) {
      (*this->fMemoryManager->_vptr_MemoryManager[4])();
    }
    this->fRegAuth = (XMLCh *)0x0;
  }
  return;
}

Assistant:

void XMLUri::setHost(const XMLCh* const newHost)
{
    if ( !newHost )
    {
        if (getHost())
            fMemoryManager->deallocate(fHost);//delete [] fHost;

        fHost = 0;
        setUserInfo(0);
        setPort(-1);

        return;
    }

    if ( *newHost && !isWellFormedAddress(newHost, fMemoryManager))
    {
        ThrowXMLwithMemMgr2(MalformedURLException
                , XMLExcepts::XMLNUM_URI_Component_Not_Conformant
                , errMsg_HOST
                , newHost
                , fMemoryManager);
    }

    if (getHost())
    {
        fMemoryManager->deallocate(fHost);//delete [] fHost;
    }

    fHost = XMLString::replicate(newHost, fMemoryManager);
    setRegBasedAuthority(0);
}